

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_client.h
# Opt level: O0

int __thiscall
blcl::net::client_interface<MsgType>::connect
          (client_interface<MsgType> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint extraout_EAX;
  pointer this_00;
  undefined4 in_register_00000034;
  exception *e;
  thread local_140;
  undefined1 local_138 [88];
  unique_ptr<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  local_e0;
  string local_d8;
  __sv_type local_b8;
  __sv_type local_a8;
  undefined1 local_98 [8];
  results_type endpoints;
  undefined1 local_70 [8];
  resolver resolver;
  uint16_t port_local;
  string *host_local;
  client_interface<MsgType> *this_local;
  
  resolver.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_._6_2_ = (ushort)__addr;
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)local_70,&this->context_,0);
  local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)CONCAT44(in_register_00000034,__fd));
  std::__cxx11::to_string
            (&local_d8,
             (uint)resolver.impl_.executor_.
                   super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                   .prop_fns_._6_2_);
  local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d8);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)local_98,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)local_70,local_a8,local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_138._84_4_ = 1;
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)local_138,&this->context_,
             0);
  std::
  make_unique<blcl::net::connection<MsgType>,blcl::net::connection<MsgType>::owner,asio::io_context&,asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,blcl::net::tsqueue<blcl::net::owned_message<MsgType>>&>
            ((owner *)&local_e0,(io_context *)(local_138 + 0x54),
             (basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)&this->context_,
             (tsqueue<blcl::net::owned_message<MsgType>_> *)local_138);
  std::
  unique_ptr<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  ::operator=(&this->connection_,&local_e0);
  std::
  unique_ptr<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  ::~unique_ptr(&local_e0);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::~basic_stream_socket
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)local_138);
  this_00 = std::
            unique_ptr<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
            ::operator->(&this->connection_);
  connection<MsgType>::connect_to_server(this_00,(results_type *)local_98);
  e = (exception *)this;
  std::thread::
  thread<blcl::net::client_interface<MsgType>::connect(std::__cxx11::string_const&,unsigned_short)::_lambda()_1_,,void>
            (&local_140,(type *)&e);
  std::thread::operator=(&this->ctx_thread_,&local_140);
  std::thread::~thread(&local_140);
  asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)local_98);
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)local_70);
  return extraout_EAX & 0xffffff00;
}

Assistant:

bool connect(const std::string& host, const uint16_t port) {
            try {
                asio::ip::tcp::resolver resolver(context_);
                auto endpoints = resolver.resolve(host, std::to_string(port));

                connection_ = std::make_unique<connection<T>>(
                        connection<T>::owner::client, context_, asio::ip::tcp::socket(context_), incoming_messages_);
                connection_->connect_to_server(endpoints);
                ctx_thread_ = std::thread([this]() { context_.run(); });
            } catch (std::exception& e) {
                std::cerr << "Client exception: " << e.what() << '\n';
                return false;
            }

            return false;
        }